

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_bufs.c
# Opt level: O3

MPP_RET hal_bufs_setup(HalBufs bufs,RK_S32 max_cnt,RK_S32 size_cnt,size_t *sizes)

{
  MPP_RET MVar1;
  undefined8 in_RAX;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  undefined4 uVar6;
  
  uVar6 = (undefined4)((ulong)in_RAX >> 0x20);
  if (bufs == (HalBufs)0x0 || sizes == (size_t *)0x0) {
    _mpp_log_l(2,"hal_bufs","invalid NULL input bufs %p sizes %p\n","hal_bufs_setup",bufs,sizes);
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else if (max_cnt - 0x29U < 0xffffffd8 || size_cnt - 9U < 0xfffffff8) {
    _mpp_log_l(2,"hal_bufs","invalid max cnt %d size cnt %d\n","hal_bufs_setup",(ulong)(uint)max_cnt
               ,(ulong)(uint)size_cnt);
    MVar1 = MPP_ERR_VALUE;
  }
  else {
    if (((byte)hal_bufs_debug & 1) != 0) {
      _mpp_log_l(4,"hal_bufs","enter\n","hal_bufs_setup");
    }
    hal_bufs_clear((HalBufsImpl *)bufs);
    if (*bufs == (MppBufferGroup)0x0) {
      MVar1 = mpp_buffer_group_get
                        ((MppBufferGroup *)bufs,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_bufs",
                         "hal_bufs_setup");
    }
    else {
      MVar1 = mpp_buffer_group_clear(*bufs);
    }
    if (*bufs == 0) {
      _mpp_log_l(2,"hal_bufs","Assertion %s failed at %s:%d\n",(char *)0x0,"impl->group",
                 "hal_bufs_setup",CONCAT44(uVar6,0xb9));
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
    }
    iVar5 = size_cnt * 8 + 0x10;
    *(int *)((long)bufs + 0x18) = iVar5;
    uVar4 = (ulong)(uint)(iVar5 * max_cnt);
    pvVar2 = mpp_osal_calloc("hal_bufs_setup",uVar4);
    *(void **)((long)bufs + 0x60) = pvVar2;
    if (pvVar2 == (void *)0x0) {
      _mpp_log_l(2,"hal_bufs","failed to malloc size %d for impl\n","hal_bufs_setup",uVar4);
      MVar1 = MPP_ERR_MALLOC;
    }
    else {
      uVar4 = 0;
      iVar5 = 0;
      do {
        iVar5 = iVar5 + (int)sizes[uVar4];
        *(size_t *)((long)bufs + uVar4 * 8 + 0x20) = sizes[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uint)size_cnt != uVar4);
      *(int *)((long)bufs + 0x14) = iVar5;
      if (0 < max_cnt) {
        iVar5 = *(int *)((long)bufs + 0x18);
        uVar4 = (ulong)(uint)max_cnt;
        lVar3 = (long)pvVar2 + 0x10;
        do {
          *(RK_S32 *)(lVar3 + -0x10) = size_cnt;
          *(long *)(lVar3 + -8) = lVar3;
          lVar3 = lVar3 + iVar5;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      *(RK_S32 *)((long)bufs + 8) = max_cnt;
      *(RK_S32 *)((long)bufs + 0xc) = size_cnt;
    }
    if (((byte)hal_bufs_debug & 1) != 0) {
      _mpp_log_l(4,"hal_bufs","leave\n","hal_bufs_setup");
    }
  }
  return MVar1;
}

Assistant:

MPP_RET hal_bufs_setup(HalBufs bufs, RK_S32 max_cnt, RK_S32 size_cnt, size_t sizes[])
{
    HalBufsImpl *impl = (HalBufsImpl *)bufs;
    MPP_RET ret = MPP_OK;
    RK_S32 elem_size = 0;
    RK_S32 impl_size = 0;

    if (NULL == bufs || NULL == sizes) {
        mpp_err_f("invalid NULL input bufs %p sizes %p\n", bufs, sizes);
        return MPP_ERR_NULL_PTR;
    }

    if (max_cnt <= 0 || max_cnt > MAX_HAL_BUFS_CNT ||
        size_cnt <= 0 || size_cnt > MAX_HAL_BUFS_SIZE_CNT) {
        mpp_err_f("invalid max cnt %d size cnt %d\n", max_cnt, size_cnt);
        return MPP_ERR_VALUE;
    }

    hal_bufs_enter();

    hal_bufs_clear(impl);

    if (impl->group)
        ret = mpp_buffer_group_clear(impl->group);
    else
        ret = mpp_buffer_group_get_internal(&impl->group, MPP_BUFFER_TYPE_ION);

    mpp_assert(impl->group);

    elem_size = sizeof(HalBuf) + sizeof(MppBuffer) * size_cnt;
    impl_size = elem_size * max_cnt;

    impl->elem_size = elem_size;
    impl->bufs = mpp_calloc_size(void, impl_size);
    if (impl->bufs) {
        RK_S32 slot_sum = 0;
        RK_S32 i;

        for (i = 0; i < size_cnt; i++) {
            slot_sum += sizes[i];
            impl->sizes[i] = sizes[i];
        }

        impl->slot_sum = slot_sum;

        for (i = 0; i < max_cnt; i++) {
            HalBuf *buf = hal_bufs_pos(impl, i);

            buf->cnt = size_cnt;
            buf->buf = (MppBuffer)(buf + 1);
        }

        impl->max_cnt = max_cnt;
        impl->size_cnt = size_cnt;
    } else {
        mpp_err_f("failed to malloc size %d for impl\n", impl_size);
        ret = MPP_ERR_MALLOC;
    }

    hal_bufs_leave();

    return ret;
}